

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_value.cpp
# Opt level: O3

bool __thiscall Am_Value::Valid(Am_Value *this)

{
  ushort uVar1;
  double dVar2;
  bool bVar3;
  
  uVar1 = this->type;
  if ((uVar1 >> 0xc & 7) - 2 < 3) goto switchD_00227dda_caseD_2;
  if ((uVar1 >> 0xc & 7) != 0) {
    return false;
  }
  bVar3 = false;
  switch(uVar1) {
  case 4:
    return (this->value).bool_value;
  case 5:
    return (bool)(-((this->value).float_value != 0.0) & 1);
  case 6:
  case 8:
    goto switchD_00227dda_caseD_6;
  case 7:
    bVar3 = (this->value).bool_value == false;
    break;
  default:
    if (uVar1 == 0x8006) {
      dVar2 = Am_Double_Data::operator_cast_to_double((Am_Double_Data *)(this->value).wrapper_value)
      ;
      return (bool)(-(dVar2 != 0.0) & 1);
    }
    if (uVar1 != 0x8008) {
      return false;
    }
  case 2:
  case 3:
  case 9:
  case 10:
switchD_00227dda_caseD_2:
    bVar3 = (this->value).wrapper_value == (Am_Wrapper *)0x0;
  }
  bVar3 = !bVar3;
switchD_00227dda_caseD_6:
  return bVar3;
}

Assistant:

bool
Am_Value::Valid() const
{
  switch (Am_Type_Class(type)) {
  case Am_ERROR_VALUE_TYPE:
    return false;
  case Am_WRAPPER:
  case Am_METHOD:
  case Am_ENUM:
    return value.voidptr_value != nullptr;
  case Am_SIMPLE_TYPE:
    switch (type) {
    case Am_STRING:
    case Am_VOIDPTR:
      return value.voidptr_value != nullptr;
    case Am_INT:
    case Am_LONG:
      return value.long_value != 0;
    case Am_BOOL:
      return value.bool_value != false;
    case Am_FLOAT:
      return value.float_value != 0.0;
    case Am_DOUBLE:
      return *(Am_Double_Data *)value.wrapper_value != 0.0;
    case Am_CHAR:
      return value.char_value != 0;
    case Am_PROC:
      return value.proc_value != nullptr;
    default:
      return false;
    }
  default:
    return false;
  }
}